

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O1

HighsStatus __thiscall
Highs::getDualRayInterface(Highs *this,bool *has_dual_ray,double *dual_ray_value)

{
  HighsLogOptions *pHVar1;
  HighsRayRecord *this_00;
  pointer pcVar2;
  uint uVar3;
  int iVar4;
  pointer pdVar5;
  bool bVar6;
  HighsStatus HVar7;
  ulong uVar8;
  ulong uVar9;
  byte bVar10;
  bool solve_relaxation;
  HighsHessian zero_hessian;
  vector<double,_std::allocator<double>_> col_cost;
  string presolve;
  vector<double,_std::allocator<double>_> zero_costs;
  HighsRayRecord primal_ray_record;
  HighsHessian hessian;
  bool local_1ad;
  HighsInt local_1ac;
  bool *local_1a8;
  vector<double,_std::allocator<double>_> *local_1a0;
  undefined1 local_198 [32];
  vector<int,_std::allocator<int>_> local_178;
  vector<double,_std::allocator<double>_> local_160;
  vector<double,_std::allocator<double>_> local_148;
  size_type local_130;
  string local_128;
  vector<double,_std::allocator<double>_> local_108;
  HighsRayRecord local_f0;
  HighsHessian local_d0;
  pointer local_80;
  vector<int,_std::allocator<int>_> local_78;
  vector<int,_std::allocator<int>_> local_60;
  vector<double,_std::allocator<double>_> local_48;
  
  uVar3 = (this->model_).lp_.num_row_;
  uVar9 = (ulong)uVar3;
  if (uVar9 == 0) {
    return kOk;
  }
  bVar10 = (this->ekk_instance_).status_.has_invert;
  *has_dual_ray = (this->ekk_instance_).dual_ray_record_.index != -1;
  local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  HighsHessian::HighsHessian(&local_d0);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_128._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  local_1ac = (this->model_).hessian_.dim_;
  bVar6 = false;
  local_1a8 = has_dual_ray;
  if (dual_ray_value == (double *)0x0) {
    HVar7 = kOk;
  }
  else {
    HVar7 = kOk;
    bVar6 = false;
    if ((*has_dual_ray & bVar10) == 0) {
      pHVar1 = &(this->options_).super_HighsOptionsStruct.log_options;
      if (this->model_status_ == kOptimal) {
        HVar7 = kOk;
        highsLogUser(pHVar1,kInfo,"Model status is optimal, so no dual ray is available\n");
        goto LAB_002339e2;
      }
      highsLogUser(pHVar1,kInfo,"Solving LP to try to compute dual ray\n");
      std::vector<double,_std::allocator<double>_>::operator=
                (&local_148,&(this->model_).lp_.col_cost_);
      if (local_1ac != 0) {
        local_d0.dim_ = (this->model_).hessian_.dim_;
        local_d0.format_ = (this->model_).hessian_.format_;
        std::vector<int,_std::allocator<int>_>::operator=
                  (&local_d0.start_,&(this->model_).hessian_.start_);
        std::vector<int,_std::allocator<int>_>::operator=
                  (&local_d0.index_,&(this->model_).hessian_.index_);
        std::vector<double,_std::allocator<double>_>::operator=
                  (&local_d0.value_,&(this->model_).hessian_.value_);
      }
      pcVar2 = local_198 + 0x10;
      local_198._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"presolve","");
      getStringOptionValues(this,(string *)local_198,&local_128,(string *)0x0);
      if ((pointer)local_198._0_8_ != pcVar2) {
        operator_delete((void *)local_198._0_8_);
      }
      local_198._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"solve_relaxation","");
      getBoolOptionValues(this,(string *)local_198,&local_1ad,(bool *)0x0);
      if ((pointer)local_198._0_8_ != pcVar2) {
        operator_delete((void *)local_198._0_8_);
      }
      local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (double *)0x0;
      local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_198._0_8_ = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                (&local_108,(long)(this->model_).lp_.num_col_,(value_type_conflict1 *)local_198);
      this_00 = &(this->ekk_instance_).primal_ray_record_;
      HighsRayRecord::getRayRecord(&local_f0,this_00);
      changeColsCost(this,0,(this->model_).lp_.num_col_ + -1,
                     local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start);
      HighsRayRecord::setRayRecord(this_00,&local_f0);
      if (local_1ac != 0) {
        HighsHessian::HighsHessian((HighsHessian *)local_198);
        local_80 = (pointer)local_198._0_8_;
        std::vector<int,_std::allocator<int>_>::vector
                  (&local_78,(vector<int,_std::allocator<int>_> *)(local_198 + 8));
        std::vector<int,_std::allocator<int>_>::vector(&local_60,&local_178);
        std::vector<double,_std::allocator<double>_>::vector(&local_48,&local_160);
        passHessian(this,(HighsHessian *)&local_80);
        if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_178.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((pointer)local_198._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_198._8_8_);
        }
      }
      local_198._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"presolve","");
      setOptionValue(this,(string *)local_198,&::kHighsOffString_abi_cxx11_);
      if ((pointer)local_198._0_8_ != pcVar2) {
        operator_delete((void *)local_198._0_8_);
      }
      local_198._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"solve_relaxation","");
      setOptionValue(this,(string *)local_198,true);
      if ((pointer)local_198._0_8_ != pcVar2) {
        operator_delete((void *)local_198._0_8_);
      }
      HVar7 = run(this);
      *local_1a8 = (this->ekk_instance_).dual_ray_record_.index != -1;
      bVar10 = (this->ekk_instance_).status_.has_invert;
      if (local_f0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (double *)0x0) {
        operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      bVar6 = true;
    }
    if (*local_1a8 == true) {
      local_1a0 = &(this->ekk_instance_).dual_ray_record_.value;
      if ((this->ekk_instance_).dual_ray_record_.value.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          (this->ekk_instance_).dual_ray_record_.value.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        pHVar1 = &(this->options_).super_HighsOptionsStruct.log_options;
        if (bVar10 == 0) {
          HVar7 = kError;
          highsLogUser(pHVar1,kError,"No LP invertible representation to compute dual ray\n");
        }
        else {
          highsLogUser(pHVar1,kInfo,"Solving linear system to compute dual ray\n");
          local_130 = (size_type)(int)uVar3;
          local_198._0_8_ = (pointer)0x0;
          local_198._8_8_ = (pointer)0x0;
          local_198._16_8_ = 0;
          iVar4 = (this->ekk_instance_).dual_ray_record_.index;
          local_f0.index = 0;
          local_f0.sign = 0;
          std::vector<double,_std::allocator<double>_>::_M_fill_assign
                    ((vector<double,_std::allocator<double>_> *)local_198,local_130,
                     (value_type_conflict1 *)&local_f0);
          *(double *)(local_198._0_8_ + (long)iVar4 * 8) =
               (double)(this->ekk_instance_).dual_ray_record_.sign;
          basisSolveInterface(this,(vector<double,_std::allocator<double>_> *)local_198,
                              dual_ray_value,(HighsInt *)0x0,(HighsInt *)0x0,true);
          std::vector<double,_std::allocator<double>_>::resize(local_1a0,local_130);
          if (0 < (int)uVar3) {
            pdVar5 = (local_1a0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar8 = 0;
            do {
              pdVar5[uVar8] = dual_ray_value[uVar8];
              uVar8 = uVar8 + 1;
            } while (uVar9 != uVar8);
          }
          if ((pointer)local_198._0_8_ != (pointer)0x0) {
            operator_delete((void *)local_198._0_8_);
          }
        }
      }
      else {
        highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                     "Copying known dual ray\n");
        if (0 < (int)uVar3) {
          pdVar5 = (local_1a0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar8 = 0;
          do {
            dual_ray_value[uVar8] = pdVar5[uVar8];
            uVar8 = uVar8 + 1;
          } while (uVar9 != uVar8);
        }
      }
    }
    else {
      HVar7 = kOk;
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
                   "No dual ray found\n");
    }
  }
  if (bVar6) {
    std::vector<double,_std::allocator<double>_>::operator=
              (&(this->model_).lp_.col_cost_,&local_148);
    if (local_1ac != 0) {
      (this->model_).hessian_.dim_ = local_d0.dim_;
      (this->model_).hessian_.format_ = local_d0.format_;
      std::vector<int,_std::allocator<int>_>::operator=
                (&(this->model_).hessian_.start_,&local_d0.start_);
      std::vector<int,_std::allocator<int>_>::operator=
                (&(this->model_).hessian_.index_,&local_d0.index_);
      std::vector<double,_std::allocator<double>_>::operator=
                (&(this->model_).hessian_.value_,&local_d0.value_);
    }
    pcVar2 = local_198 + 0x10;
    local_198._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"presolve","");
    setOptionValue(this,(string *)local_198,&local_128);
    if ((pointer)local_198._0_8_ != pcVar2) {
      operator_delete((void *)local_198._0_8_);
    }
    local_198._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"solve_relaxation","");
    setOptionValue(this,(string *)local_198,local_1ad);
    if ((pointer)local_198._0_8_ != pcVar2) {
      operator_delete((void *)local_198._0_8_);
    }
    (this->info_).super_HighsInfoStruct.dual_solution_status = 0;
    (this->info_).super_HighsInfoStruct.objective_function_value = 0.0;
    (this->info_).super_HighsInfoStruct.num_dual_infeasibilities = -1;
    (this->info_).super_HighsInfoStruct.max_dual_infeasibility = INFINITY;
    (this->info_).super_HighsInfoStruct.sum_dual_infeasibilities = INFINITY;
    (this->info_).super_HighsInfoStruct.max_complementarity_violation = INFINITY;
    (this->info_).super_HighsInfoStruct.sum_complementarity_violations = INFINITY;
    if (*local_1a8 == false) {
      this->model_status_ = kMin;
    }
  }
LAB_002339e2:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  if (local_d0.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.value_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_d0.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d0.index_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_d0.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d0.start_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return HVar7;
}

Assistant:

HighsStatus Highs::getDualRayInterface(bool& has_dual_ray,
                                       double* dual_ray_value) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsLp& lp = model_.lp_;
  HighsInt num_row = lp.num_row_;
  // For an LP with no rows the dual ray is vacuous
  if (num_row == 0) return return_status;
  bool has_invert = ekk_instance_.status_.has_invert;
  assert(!lp.is_moved_);
  has_dual_ray = ekk_instance_.dual_ray_record_.index != kNoRayIndex;

  // Declare identifiers to save column costs, integrality, any Hessian and the
  // presolve setting, and a flag to know when they should be
  // recovered
  std::vector<double> col_cost;
  HighsHessian hessian;
  bool solve_relaxation;
  std::string presolve;
  bool solve_feasibility_problem = false;
  const bool is_qp = model_.isQp();

  if (dual_ray_value != NULL) {
    // User wants a dual ray whatever
    if (!has_dual_ray || !has_invert) {
      // No dual ray is known, or no INVERT to compute it
      //
      // No point in trying to get a dual ray if the model status is
      // optimal
      if (this->model_status_ == HighsModelStatus::kOptimal) {
        highsLogUser(options_.log_options, HighsLogType::kInfo,
                     "Model status is optimal, so no dual ray is available\n");
        return return_status;
      }
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "Solving LP to try to compute dual ray\n");
      // Save the column costs, integrality, any Hessian and the
      // presolve setting
      col_cost = lp.col_cost_;
      if (is_qp) hessian = model_.hessian_;
      this->getOptionValue("presolve", presolve);
      this->getOptionValue("solve_relaxation", solve_relaxation);
      solve_feasibility_problem = true;
      // Zero the costs, integrality and Hessian
      std::vector<double> zero_costs;
      zero_costs.assign(lp.num_col_, 0);
      // Take a copy of the primal ray record, since this will be
      // cleared by calling changeColsCost
      HighsRayRecord primal_ray_record =
          this->ekk_instance_.primal_ray_record_.getRayRecord();
      HighsStatus status =
          this->changeColsCost(0, lp.num_col_ - 1, zero_costs.data());
      assert(status == HighsStatus::kOk);
      // Reinstate the primal ray record
      this->ekk_instance_.primal_ray_record_.setRayRecord(primal_ray_record);
      if (is_qp) {
        HighsHessian zero_hessian;
        this->passHessian(zero_hessian);
      }
      this->setOptionValue("presolve", kHighsOffString);
      this->setOptionValue("solve_relaxation", true);
      HighsStatus call_status = this->run();
      if (call_status != HighsStatus::kOk) return_status = call_status;
      has_dual_ray = ekk_instance_.dual_ray_record_.index != kNoRayIndex;
      has_invert = ekk_instance_.status_.has_invert;
      assert(has_invert);
    }
    if (has_dual_ray) {
      if (ekk_instance_.dual_ray_record_.value.size()) {
        // Dual ray is already computed
        highsLogUser(options_.log_options, HighsLogType::kInfo,
                     "Copying known dual ray\n");
        for (HighsInt iRow = 0; iRow < num_row; iRow++)
          dual_ray_value[iRow] = ekk_instance_.dual_ray_record_.value[iRow];
      } else if (has_invert) {
        // Dual ray is known and can be calculated
        highsLogUser(options_.log_options, HighsLogType::kInfo,
                     "Solving linear system to compute dual ray\n");
        vector<double> rhs;
        HighsInt iRow = ekk_instance_.dual_ray_record_.index;
        rhs.assign(num_row, 0);
        rhs[iRow] = ekk_instance_.dual_ray_record_.sign;
        HighsInt* dual_ray_num_nz = 0;
        basisSolveInterface(rhs, dual_ray_value, dual_ray_num_nz, NULL, true);
        // Now save the dual ray itself
        ekk_instance_.dual_ray_record_.value.resize(num_row);
        for (HighsInt iRow = 0; iRow < num_row; iRow++)
          ekk_instance_.dual_ray_record_.value[iRow] = dual_ray_value[iRow];
      } else {
        assert(!has_invert);
        // Dual ray is known but cannot be calculated
        highsLogUser(options_.log_options, HighsLogType::kError,
                     "No LP invertible representation to compute dual ray\n");
        return_status = HighsStatus::kError;
      }
    } else {
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "No dual ray found\n");
      return_status = HighsStatus::kOk;
    }
  }
  if (solve_feasibility_problem) {
    // Feasibility problem has been solved, so any objective-related
    // information has been lost. Reverting the objective function via
    // Highs calls clears info_, so better to just copy the data
    // directly and set the info_ entries that are no longer valid
    lp.col_cost_ = col_cost;
    if (is_qp) model_.hessian_ = hessian;
    this->setOptionValue("presolve", presolve);
    this->setOptionValue("solve_relaxation", solve_relaxation);
    // Modify the objective-related information
    this->info_.dual_solution_status = SolutionStatus::kSolutionStatusNone;
    this->info_.objective_function_value = 0;
    this->info_.num_dual_infeasibilities = kHighsIllegalInfeasibilityCount;
    this->info_.max_dual_infeasibility = kHighsIllegalInfeasibilityMeasure;
    this->info_.sum_dual_infeasibilities = kHighsIllegalInfeasibilityMeasure;
    this->info_.max_complementarity_violation =
        kHighsIllegalComplementarityViolation;
    this->info_.sum_complementarity_violations =
        kHighsIllegalComplementarityViolation;
    if (has_dual_ray) {
      assert(this->info_.num_primal_infeasibilities > 0);
      assert(this->model_status_ == HighsModelStatus::kInfeasible);
    } else {
      // If someone has tried to get a dual ray for a feasible
      // problem, then any status of the original model has been lost
      this->model_status_ = HighsModelStatus::kNotset;
    }
  }
  return return_status;
}